

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.h
# Opt level: O0

void trieste::detail::register_token(TokenDef *def)

{
  iterator this;
  bool bVar1;
  _Base_ptr this_00;
  runtime_error *this_01;
  char *pcVar2;
  mapped_type *pmVar3;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  Token local_98;
  Token t;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Self local_38;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  _Self local_20;
  iterator it;
  map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
  *map;
  TokenDef *def_local;
  
  this_00 = (_Base_ptr)token_map();
  it._M_node = this_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,def->name);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
       ::find((map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
               *)this_00,&local_30);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
       ::end(it._M_node);
  bVar1 = std::operator==(&local_20,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Token::Token(&local_98,def);
    this = it;
    pcVar2 = Token::str(&local_98);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a8,pcVar2);
    pmVar3 = std::
             map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
             ::operator[]((map<std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_trieste::Token>_>_>
                           *)this._M_node,&local_a8);
    pmVar3->def = local_98.def;
    return;
  }
  t.def._3_1_ = 1;
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  pcVar2 = def->name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar2,&local_79);
  std::operator+(&local_58,"Duplicate token definition: ",&local_78);
  std::runtime_error::runtime_error(this_01,(string *)&local_58);
  t.def._3_1_ = 0;
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void register_token(const TokenDef& def)
    {
      auto& map = token_map();
      auto it = map.find(def.name);
      if (it != map.end())
        throw std::runtime_error(
          "Duplicate token definition: " + std::string(def.name));

      Token t = def;
      map[t.str()] = t;
    }